

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O2

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  Snapshot snapshot;
  Snapshot local_50;
  cmCommandContext local_38;
  
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  (this->super_cmLinkItem).super_string._M_string_length = 0;
  (this->super_cmLinkItem).super_string.field_2._M_local_buf[0] = '\0';
  (this->super_cmLinkItem).Target = (cmGeneratorTarget *)0x0;
  cmState::Snapshot::Snapshot(&local_50,(cmState *)0x0);
  local_38.Name._M_dataplus._M_p = (pointer)&local_38.Name.field_2;
  local_38.Name._M_string_length = 0;
  local_38.Name.field_2._M_local_buf[0] = '\0';
  local_38.Line = 0;
  snapshot.Position.Tree = local_50.Position.Tree;
  snapshot.State = local_50.State;
  snapshot.Position.Position = local_50.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}